

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationroot.cpp
# Opt level: O2

CollationCacheEntry * icu_63::CollationRoot::getRootCacheEntry(UErrorCode *errorCode)

{
  CollationCacheEntry *pCVar1;
  
  umtx_initOnce((UInitOnce *)&(anonymous_namespace)::initOnce,load,errorCode);
  pCVar1 = (anonymous_namespace)::rootSingleton;
  if (U_ZERO_ERROR < *errorCode) {
    pCVar1 = (CollationCacheEntry *)0x0;
  }
  return pCVar1;
}

Assistant:

const CollationCacheEntry *
CollationRoot::getRootCacheEntry(UErrorCode &errorCode) {
    umtx_initOnce(initOnce, CollationRoot::load, errorCode);
    if(U_FAILURE(errorCode)) { return NULL; }
    return rootSingleton;
}